

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void MergeUVRow_C(uint8_t *src_u,uint8_t *src_v,uint8_t *dst_uv,int width)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (long)width - 1;
  if (1 < width) {
    uVar2 = 0;
    do {
      *dst_uv = src_u[uVar2];
      dst_uv[1] = src_v[uVar2];
      dst_uv[2] = src_u[uVar2 + 1];
      dst_uv[3] = src_v[uVar2 + 1];
      dst_uv = dst_uv + 4;
      uVar2 = uVar2 + 2;
    } while (uVar2 < (uVar1 & 0xffffffff));
  }
  if ((width & 1U) != 0) {
    *dst_uv = src_u[uVar1];
    dst_uv[1] = src_v[uVar1];
  }
  return;
}

Assistant:

void MergeUVRow_C(const uint8_t* src_u,
                  const uint8_t* src_v,
                  uint8_t* dst_uv,
                  int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_uv[0] = src_u[x];
    dst_uv[1] = src_v[x];
    dst_uv[2] = src_u[x + 1];
    dst_uv[3] = src_v[x + 1];
    dst_uv += 4;
  }
  if (width & 1) {
    dst_uv[0] = src_u[width - 1];
    dst_uv[1] = src_v[width - 1];
  }
}